

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O0

string * __thiscall test_conv_transpose_1d::vars_abi_cxx11_(test_conv_transpose_1d *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  int *in_stack_fffffffffffffd98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_240 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd8;
  string local_220 [8];
  array<long,_4UL> *in_stack_fffffffffffffde8;
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [48];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  string local_30 [48];
  
  __lhs = in_RDI;
  var_to_str<long,4ul>(in_stack_fffffffffffffde8);
  std::operator+((char *)__lhs,in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  var_to_str<long,4ul>(in_stack_fffffffffffffde8);
  std::operator+((char *)__lhs,in_RDI);
  std::operator+(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
  std::operator+(__lhs,(char *)in_RDI);
  var_to_str<int>(in_stack_fffffffffffffd98);
  std::operator+((char *)__lhs,in_RDI);
  std::operator+(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
  std::operator+(__lhs,(char *)in_RDI);
  var_to_str<int>(in_stack_fffffffffffffd98);
  std::operator+((char *)__lhs,in_RDI);
  std::operator+(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
  std::operator+(__lhs,(char *)in_RDI);
  var_to_str<int>(in_stack_fffffffffffffd98);
  std::operator+((char *)__lhs,in_RDI);
  std::operator+(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
  std::__cxx11::string::~string(local_220);
  std::__cxx11::string::~string(local_240);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::string::~string(local_200);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_1a0);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string(local_160);
  std::__cxx11::string::~string(local_180);
  std::__cxx11::string::~string(local_f0);
  std::__cxx11::string::~string(local_110);
  std::__cxx11::string::~string(local_130);
  return __lhs;
}

Assistant:

std::string vars() override {
        return VARS_TO_STR5(ne_input, ne_kernel, s0, p0, d0);
    }